

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DeleteShader::exec(DeleteShader *this,Thread *t)

{
  deUint32 err;
  deBool dVar1;
  Shader *pSVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  GLuint local_24;
  Thread *pTStack_20;
  GLuint shader;
  EGLThread *thread;
  Thread *t_local;
  DeleteShader *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  pSVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  local_24 = pSVar2->shader;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [25])"Begin -- glDeleteShader(");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_24);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x470))(local_24);
    err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"deleteShader(shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x56f);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [24])"End -- glDeleteShader()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  pSVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pSVar2->shader = 0;
  return;
}

Assistant:

void DeleteShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint shader = m_shader->shader;

	thread.newMessage() << "Begin -- glDeleteShader(" << shader << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, deleteShader(shader));
	thread.newMessage() << "End -- glDeleteShader()" << tcu::ThreadUtil::Message::End;

	m_shader->shader = 0;
}